

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.hpp
# Opt level: O0

void __thiscall OpenMD::LJ::~LJ(LJ *this)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  *in_RDI = &PTR__LJ_005011b8;
  std::__cxx11::string::~string((string *)(in_RDI + 0x16));
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x2e6f6e);
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::~vector((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
             *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x2e6f98);
  VanDerWaalsInteraction::~VanDerWaalsInteraction((VanDerWaalsInteraction *)0x2e6fa2);
  return;
}

Assistant:

void setForceField(ForceField* ff) { forceField_ = ff; }